

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O0

void __thiscall KktCheck::chComplementarySlackness(KktCheck *this)

{
  double dVar1;
  bool bVar2;
  reference pvVar3;
  ostream *poVar4;
  reference pvVar5;
  int *in_RDI;
  vector<double,_std::allocator<double>_> *pvVar6;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  bool istrue;
  
  bVar2 = true;
  in_RDI[0x44] = 0;
  while (in_RDI[0x44] < *in_RDI) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1a),
                        (long)in_RDI[0x44]);
    if (-1e+200 < *pvVar3) {
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x5a),(long)in_RDI[0x44]);
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1a),(long)in_RDI[0x44]);
      pvVar6 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x60);
      std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(long)in_RDI[0x44]);
      std::abs((int)pvVar6);
      if (*(double *)(in_RDI + 0x48) <= extraout_XMM0_Qa &&
          extraout_XMM0_Qa != *(double *)(in_RDI + 0x48)) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x5a),
                            (long)in_RDI[0x44]);
        dVar1 = *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),
                            (long)in_RDI[0x44]);
        if ((dVar1 != *pvVar3) || (NAN(dVar1) || NAN(*pvVar3))) {
          pvVar6 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x60);
          std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(long)in_RDI[0x44]);
          std::abs((int)pvVar6);
          if (*(double *)(in_RDI + 0x48) <= extraout_XMM0_Qa_00 &&
              extraout_XMM0_Qa_00 != *(double *)(in_RDI + 0x48)) {
            if (in_RDI[0x58] == 1) {
              poVar4 = std::operator<<((ostream *)&std::cout,"Comp. slackness fail: ");
              poVar4 = std::operator<<(poVar4,"l[");
              pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x52),
                                  (long)in_RDI[0x44]);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar5);
              poVar4 = std::operator<<(poVar4,"]=");
              pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1a),
                                  (long)in_RDI[0x44]);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar3);
              poVar4 = std::operator<<(poVar4,", x[");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RDI[0x44]);
              poVar4 = std::operator<<(poVar4,"]=");
              pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x5a),
                                  (long)in_RDI[0x44]);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar3);
              poVar4 = std::operator<<(poVar4,", z[");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RDI[0x44]);
              poVar4 = std::operator<<(poVar4,"]=");
              pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x60),
                                  (long)in_RDI[0x44]);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar3);
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            }
            bVar2 = false;
          }
        }
      }
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),
                        (long)in_RDI[0x44]);
    if (*pvVar3 <= 1e+200 && *pvVar3 != 1e+200) {
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),(long)in_RDI[0x44]);
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x5a),(long)in_RDI[0x44]);
      pvVar6 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x60);
      std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(long)in_RDI[0x44]);
      std::abs((int)pvVar6);
      if (*(double *)(in_RDI + 0x48) <= extraout_XMM0_Qa_01 &&
          extraout_XMM0_Qa_01 != *(double *)(in_RDI + 0x48)) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x5a),
                            (long)in_RDI[0x44]);
        dVar1 = *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1a),
                            (long)in_RDI[0x44]);
        if ((dVar1 != *pvVar3) || (NAN(dVar1) || NAN(*pvVar3))) {
          pvVar6 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x60);
          std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(long)in_RDI[0x44]);
          std::abs((int)pvVar6);
          if (*(double *)(in_RDI + 0x48) <= extraout_XMM0_Qa_02 &&
              extraout_XMM0_Qa_02 != *(double *)(in_RDI + 0x48)) {
            if (in_RDI[0x58] == 1) {
              poVar4 = std::operator<<((ostream *)&std::cout,"Comp. slackness fail: x[");
              pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x52),
                                  (long)in_RDI[0x44]);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar5);
              poVar4 = std::operator<<(poVar4,"]=");
              pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x5a),
                                  (long)in_RDI[0x44]);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar3);
              poVar4 = std::operator<<(poVar4,", u[");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RDI[0x44]);
              poVar4 = std::operator<<(poVar4,"]=");
              pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),
                                  (long)in_RDI[0x44]);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar3);
              poVar4 = std::operator<<(poVar4,", z[");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RDI[0x44]);
              poVar4 = std::operator<<(poVar4,"]=");
              pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x60),
                                  (long)in_RDI[0x44]);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar3);
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            }
            bVar2 = false;
          }
        }
      }
    }
    in_RDI[0x44] = in_RDI[0x44] + 1;
  }
  if (bVar2) {
    if (in_RDI[0x58] == 1) {
      std::operator<<((ostream *)&std::cout,"Complementary Slackness.\n");
    }
  }
  else {
    if (in_RDI[0x58] == 1) {
      std::operator<<((ostream *)&std::cout,"KKT check error: Comp slackness fail.\n");
    }
    *(undefined1 *)(in_RDI + 0x4a) = 1;
  }
  return;
}

Assistant:

void KktCheck::chComplementarySlackness() {
	bool istrue = true;
	
	for (i=0; i<numCol;i++) {
		if (colLower[i] > -HSOL_CONST_INF)  
			if (abs( (colValue[i]- colLower[i])*(colDual[i]) ) > tol && colValue[i]!=colUpper[i] && abs(colDual[i])> tol) {
				if (print == 1) 
					cout<<"Comp. slackness fail: "<<"l["<<cIndexRev[i]<<"]="<<colLower[i]<<", x["<<i<<"]="<<colValue[i]<<", z["<<i<<"]="<<colDual[i]<<endl;
					//cout<<"Comp. slackness fail: "<<"l["<<i<<"]="<<colLower[i]<<", x["<<i<<"]="<<colValue[i]<<", z["<<i<<"]="<<colDual[i]<<endl;
				istrue = false;
			}
		if (colUpper[i] < HSOL_CONST_INF) 
			if (abs( (colUpper[i] - colValue[i])*(colDual[i]) )> tol && colValue[i]!=colLower[i] && abs(colDual[i])> tol) {
				if (print == 1) 
					cout<<"Comp. slackness fail: x["<<cIndexRev[i]<<"]="<<colValue[i]<<", u["<<i<<"]="<<colUpper[i]<<", z["<<i<<"]="<<colDual[i]<<endl;
					//cout<<"Comp. slackness fail: x["<<i<<"]="<<colValue[i]<<", u["<<i<<"]="<<colUpper[i]<<", z["<<i<<"]="<<colDual[i]<<endl;
				istrue = false;
			}
	}
	
	if (istrue) {
		if (print == 1) 
			cout<<"Complementary Slackness.\n";}
	else {
		if (print == 1) 
			cout<<"KKT check error: Comp slackness fail.\n";
		istrueGlb = true;
	}
}